

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hh
# Opt level: O2

void __thiscall SatLookAngles::SatLookAngles(SatLookAngles *this,double lat,double lon,double alt)

{
  DateTime DVar1;
  
  (this->_sats).
  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_sats).
  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_sats).
  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Observer::Observer(&this->_me,lat,lon,alt);
  DVar1 = DateTime::Now(true);
  (this->_time).m_encoded = DVar1.m_encoded;
  return;
}

Assistant:

SatLookAngles(double lat, double lon, double alt)
      : _me(lat, lon, alt), _time(DateTime::Now(true)) {}